

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O0

ssl_open_record_t bssl::skip_early_data(SSL *ssl,uint8_t *out_alert,size_t consumed)

{
  size_t consumed_local;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  
  ssl->s3->early_data_skipped = ssl->s3->early_data_skipped + (short)consumed;
  if (ssl->s3->early_data_skipped < consumed) {
    ssl->s3->early_data_skipped = 0x4001;
  }
  if (ssl->s3->early_data_skipped < 0x4001) {
    ssl_local._4_4_ = ssl_open_record_discard;
  }
  else {
    ERR_put_error(0x10,0,0x10e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                  ,0x46);
    *out_alert = '\n';
    ssl_local._4_4_ = ssl_open_record_error;
  }
  return ssl_local._4_4_;
}

Assistant:

static ssl_open_record_t skip_early_data(SSL *ssl, uint8_t *out_alert,
                                         size_t consumed) {
  ssl->s3->early_data_skipped += consumed;
  if (ssl->s3->early_data_skipped < consumed) {
    ssl->s3->early_data_skipped = kMaxEarlyDataSkipped + 1;
  }

  if (ssl->s3->early_data_skipped > kMaxEarlyDataSkipped) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MUCH_SKIPPED_EARLY_DATA);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  return ssl_open_record_discard;
}